

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

void __thiscall QString::resize(QString *this,qsizetype newSize,QChar fillChar)

{
  ulong uVar1;
  char16_t *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ulong uVar12;
  long lVar13;
  char16_t __tmp;
  int iVar15;
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar27;
  int iVar32;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar33;
  int iVar35;
  undefined1 auVar34 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar38 [16];
  
  uVar1 = (this->d).size;
  resize(this,newSize);
  auVar11 = _DAT_00139050;
  auVar10 = _DAT_00139040;
  auVar9 = _DAT_00139030;
  auVar8 = _DAT_00139020;
  auVar7 = _DAT_00139010;
  uVar12 = (this->d).size;
  if (uVar1 < uVar12) {
    pcVar2 = (this->d).ptr;
    uVar12 = (uVar12 * 2 + uVar1 * -2) - 2;
    auVar18._8_4_ = (int)uVar12;
    auVar18._0_8_ = uVar12;
    auVar18._12_4_ = (int)(uVar12 >> 0x20);
    auVar14._0_8_ = uVar12 >> 1;
    auVar14._8_8_ = auVar18._8_8_ >> 1;
    lVar13 = 0;
    auVar14 = auVar14 ^ _DAT_00139050;
    do {
      auVar26._8_4_ = (int)lVar13;
      auVar26._0_8_ = lVar13;
      auVar26._12_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar18 = (auVar26 | auVar10) ^ auVar11;
      iVar27 = auVar14._0_4_;
      iVar33 = -(uint)(iVar27 < auVar18._0_4_);
      iVar15 = auVar14._4_4_;
      auVar19._4_4_ = -(uint)(iVar15 < auVar18._4_4_);
      iVar32 = auVar14._8_4_;
      iVar35 = -(uint)(iVar32 < auVar18._8_4_);
      iVar16 = auVar14._12_4_;
      auVar19._12_4_ = -(uint)(iVar16 < auVar18._12_4_);
      auVar28._4_4_ = iVar33;
      auVar28._0_4_ = iVar33;
      auVar28._8_4_ = iVar35;
      auVar28._12_4_ = iVar35;
      auVar36 = pshuflw(in_XMM11,auVar28,0xe8);
      auVar21._4_4_ = -(uint)(auVar18._4_4_ == iVar15);
      auVar21._12_4_ = -(uint)(auVar18._12_4_ == iVar16);
      auVar21._0_4_ = auVar21._4_4_;
      auVar21._8_4_ = auVar21._12_4_;
      auVar38 = pshuflw(in_XMM12,auVar21,0xe8);
      auVar19._0_4_ = auVar19._4_4_;
      auVar19._8_4_ = auVar19._12_4_;
      auVar18 = pshuflw(auVar36,auVar19,0xe8);
      auVar37._8_4_ = 0xffffffff;
      auVar37._0_8_ = 0xffffffffffffffff;
      auVar37._12_4_ = 0xffffffff;
      auVar37 = (auVar18 | auVar38 & auVar36) ^ auVar37;
      auVar18 = packssdw(auVar37,auVar37);
      if ((auVar18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar2[uVar1 + lVar13] = fillChar.ucs;
      }
      auVar19 = auVar21 & auVar28 | auVar19;
      auVar18 = packssdw(auVar19,auVar19);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar18 = packssdw(auVar18 ^ auVar3,auVar18 ^ auVar3);
      if ((auVar18._0_4_ >> 0x10 & 1) != 0) {
        pcVar2[uVar1 + lVar13 + 1] = fillChar.ucs;
      }
      auVar18 = (auVar26 | auVar9) ^ auVar11;
      iVar33 = -(uint)(iVar27 < auVar18._0_4_);
      auVar34._4_4_ = -(uint)(iVar15 < auVar18._4_4_);
      iVar35 = -(uint)(iVar32 < auVar18._8_4_);
      auVar34._12_4_ = -(uint)(iVar16 < auVar18._12_4_);
      auVar20._4_4_ = iVar33;
      auVar20._0_4_ = iVar33;
      auVar20._8_4_ = iVar35;
      auVar20._12_4_ = iVar35;
      auVar29._4_4_ = -(uint)(auVar18._4_4_ == iVar15);
      auVar29._12_4_ = -(uint)(auVar18._12_4_ == iVar16);
      auVar29._0_4_ = auVar29._4_4_;
      auVar29._8_4_ = auVar29._12_4_;
      auVar34._0_4_ = auVar34._4_4_;
      auVar34._8_4_ = auVar34._12_4_;
      auVar18 = auVar29 & auVar20 | auVar34;
      auVar18 = packssdw(auVar18,auVar18);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar18 = packssdw(auVar18 ^ auVar4,auVar18 ^ auVar4);
      if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pcVar2[uVar1 + lVar13 + 2] = fillChar.ucs;
      }
      auVar37 = pshufhw(auVar20,auVar20,0x84);
      auVar19 = pshufhw(auVar29,auVar29,0x84);
      auVar21 = pshufhw(auVar37,auVar34,0x84);
      auVar22._8_4_ = 0xffffffff;
      auVar22._0_8_ = 0xffffffffffffffff;
      auVar22._12_4_ = 0xffffffff;
      auVar22 = (auVar21 | auVar19 & auVar37) ^ auVar22;
      auVar37 = packssdw(auVar22,auVar22);
      if ((auVar37 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pcVar2[uVar1 + lVar13 + 3] = fillChar.ucs;
      }
      auVar37 = (auVar26 | auVar8) ^ auVar11;
      iVar33 = -(uint)(iVar27 < auVar37._0_4_);
      auVar24._4_4_ = -(uint)(iVar15 < auVar37._4_4_);
      iVar35 = -(uint)(iVar32 < auVar37._8_4_);
      auVar24._12_4_ = -(uint)(iVar16 < auVar37._12_4_);
      auVar30._4_4_ = iVar33;
      auVar30._0_4_ = iVar33;
      auVar30._8_4_ = iVar35;
      auVar30._12_4_ = iVar35;
      auVar18 = pshuflw(auVar18,auVar30,0xe8);
      auVar23._4_4_ = -(uint)(auVar37._4_4_ == iVar15);
      auVar23._12_4_ = -(uint)(auVar37._12_4_ == iVar16);
      auVar23._0_4_ = auVar23._4_4_;
      auVar23._8_4_ = auVar23._12_4_;
      in_XMM12 = pshuflw(auVar38 & auVar36,auVar23,0xe8);
      in_XMM12 = in_XMM12 & auVar18;
      auVar24._0_4_ = auVar24._4_4_;
      auVar24._8_4_ = auVar24._12_4_;
      auVar18 = pshuflw(auVar18,auVar24,0xe8);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar36 = (auVar18 | in_XMM12) ^ auVar36;
      in_XMM11 = packssdw(auVar36,auVar36);
      if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar2[uVar1 + lVar13 + 4] = fillChar.ucs;
      }
      auVar24 = auVar23 & auVar30 | auVar24;
      auVar18 = packssdw(auVar24,auVar24);
      auVar38._8_4_ = 0xffffffff;
      auVar38._0_8_ = 0xffffffffffffffff;
      auVar38._12_4_ = 0xffffffff;
      auVar18 = packssdw(auVar18 ^ auVar38,auVar18 ^ auVar38);
      if ((auVar18 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pcVar2[uVar1 + lVar13 + 5] = fillChar.ucs;
      }
      auVar18 = (auVar26 | auVar7) ^ auVar11;
      iVar27 = -(uint)(iVar27 < auVar18._0_4_);
      auVar31._4_4_ = -(uint)(iVar15 < auVar18._4_4_);
      iVar32 = -(uint)(iVar32 < auVar18._8_4_);
      auVar31._12_4_ = -(uint)(iVar16 < auVar18._12_4_);
      auVar25._4_4_ = iVar27;
      auVar25._0_4_ = iVar27;
      auVar25._8_4_ = iVar32;
      auVar25._12_4_ = iVar32;
      auVar17._4_4_ = -(uint)(auVar18._4_4_ == iVar15);
      auVar17._12_4_ = -(uint)(auVar18._12_4_ == iVar16);
      auVar17._0_4_ = auVar17._4_4_;
      auVar17._8_4_ = auVar17._12_4_;
      auVar31._0_4_ = auVar31._4_4_;
      auVar31._8_4_ = auVar31._12_4_;
      auVar18 = auVar17 & auVar25 | auVar31;
      auVar18 = packssdw(auVar18,auVar18);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar18 = packssdw(auVar18 ^ auVar5,auVar18 ^ auVar5);
      if ((auVar18 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pcVar2[uVar1 + lVar13 + 6] = fillChar.ucs;
      }
      auVar37 = pshufhw(auVar25,auVar25,0x84);
      auVar18 = pshufhw(auVar17,auVar17,0x84);
      auVar26 = pshufhw(auVar37,auVar31,0x84);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar18 = packssdw(auVar18 & auVar37,(auVar26 | auVar18 & auVar37) ^ auVar6);
      if ((auVar18 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pcVar2[uVar1 + lVar13 + 7] = fillChar.ucs;
      }
      lVar13 = lVar13 + 8;
    } while ((uVar12 >> 4) * 8 + 8 != lVar13);
  }
  return;
}

Assistant:

void QString::resize(qsizetype newSize, QChar fillChar)
{
    const qsizetype oldSize = size();
    resize(newSize);
    const qsizetype difference = size() - oldSize;
    if (difference > 0)
        std::fill_n(d.data() + oldSize, difference, fillChar.unicode());
}